

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

map map_create(map_cb_hash hash_cb,map_cb_compare compare_cb)

{
  map __ptr;
  size_t size;
  bucket pbVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  if (hash_cb == (map_cb_hash)0x0 || compare_cb == (map_cb_compare)0x0) {
    pcVar2 = "Invalid map creation parameters";
    uStack_20 = 0x44;
  }
  else {
    __ptr = (map)malloc(0x30);
    if (__ptr != (map)0x0) {
      __ptr->hash_cb = hash_cb;
      __ptr->compare_cb = compare_cb;
      __ptr->count = 0;
      __ptr->prime = 0;
      size = bucket_capacity(0);
      __ptr->capacity = size;
      pbVar1 = bucket_create(size);
      __ptr->buckets = pbVar1;
      if (pbVar1 != (bucket)0x0) {
        return __ptr;
      }
      log_write_impl_va("metacall",0x59,"map_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Bad map bucket creation");
      free(__ptr);
      return (map)0x0;
    }
    pcVar2 = "Bad map allocation";
    uStack_20 = 0x4c;
  }
  log_write_impl_va("metacall",uStack_20,"map_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                    ,3,pcVar2);
  return (map)0x0;
}

Assistant:

map map_create(map_cb_hash hash_cb, map_cb_compare compare_cb)
{
	map m;

	if (hash_cb == NULL || compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map creation parameters");
		return NULL;
	}

	m = malloc(sizeof(struct map_type));

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map allocation");
		return NULL;
	}

	m->hash_cb = hash_cb;
	m->compare_cb = compare_cb;
	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map bucket creation");
		free(m);
		return NULL;
	}

	return m;
}